

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# material.h
# Opt level: O0

void __thiscall
GlassMaterial::GlassMaterial
          (GlassMaterial *this,float coef,Texture *reflect_color,Texture *refract_color,
          float thickness)

{
  float fVar1;
  Vector3f *this_00;
  Material *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  Texture *in_stack_fffffffffffffe38;
  Texture *in_stack_fffffffffffffe40;
  Vector3f *c;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe64;
  float in_stack_fffffffffffffe6c;
  Texture *in_stack_fffffffffffffe70;
  Texture *in_stack_fffffffffffffe78;
  BRDFMaterial *in_stack_fffffffffffffe80;
  Vector3f local_124 [10];
  Vector3f local_ac [11];
  undefined4 local_24;
  undefined4 local_c;
  
  local_24 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  Material::Material(in_RDI);
  in_RDI->_vptr_Material = (_func_int **)&PTR_shade_003d2998;
  Texture::Texture(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  c = (Vector3f *)(in_RDI + 0xe);
  Texture::Texture(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  *(undefined4 *)&in_RDI[0x1b]._vptr_Material = local_c;
  *(undefined4 *)&in_RDI[0x1d]._vptr_Material = local_24;
  *(float *)&in_RDI[0x1b]._vptr_Material = 1.0 / *(float *)&in_RDI[0x1b]._vptr_Material;
  *(float *)((long)&in_RDI[0x1b]._vptr_Material + 4) =
       (1.0 - *(float *)&in_RDI[0x1b]._vptr_Material) /
       (*(float *)&in_RDI[0x1b]._vptr_Material + 1.0);
  fVar1 = *(float *)((long)&in_RDI[0x1b]._vptr_Material + 4);
  *(float *)((long)&in_RDI[0x1b]._vptr_Material + 4) = fVar1 * fVar1;
  this_00 = (Vector3f *)operator_new(0x148);
  uVar2 = CONCAT13(1,(int3)in_stack_fffffffffffffe60);
  Vector3f::Vector3f(local_ac,0.5,0.5,0.5);
  Texture::Texture((Texture *)CONCAT44(in_stack_fffffffffffffe64,uVar2),c);
  Vector3f::Vector3f(local_124,0.5,0.5,0.5);
  Texture::Texture((Texture *)CONCAT44(in_stack_fffffffffffffe64,uVar2),c);
  Vector3f::Vector3f(this_00,(Vector3f *)in_stack_fffffffffffffe38);
  Texture::Texture((Texture *)CONCAT44(in_stack_fffffffffffffe64,uVar2),c);
  BRDFMaterial::BRDFMaterial
            (in_stack_fffffffffffffe80,in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,
             in_stack_fffffffffffffe6c,(Texture *)CONCAT44(in_stack_fffffffffffffe64,uVar2));
  in_RDI[0x1c]._vptr_Material = (_func_int **)this_00;
  Texture::~Texture((Texture *)0x35a4e7);
  Texture::~Texture((Texture *)0x35a4f4);
  Texture::~Texture((Texture *)0x35a501);
  return;
}

Assistant:

GlassMaterial(float coef = 1,
		const Texture & reflect_color = Vector3f::ZERO,
		const Texture & refract_color = Vector3f::ZERO,
		float thickness = 0) :
		refractCoef(coef),
		reflectColor(reflect_color), refractColor(refract_color),
		thickness(thickness) {
		refractCoef = 1 / refractCoef;
		r0 = (1 - refractCoef) / (1 + refractCoef); r0 *= r0;
		m = new BRDFMaterial(Vector3f(0.5, 0.5, 0.5), Vector3f(0.5, 0.5, 0.5), 0.3);
	}